

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_params.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> *
libtorrent::write_session_params_buf
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,session_params *sp,
          save_state_flags_t flags)

{
  entry e;
  entry eStack_38;
  
  write_session_params(&eStack_38,sp,flags);
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)__return_storage_ptr__
             ,&eStack_38);
  entry::~entry(&eStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> write_session_params_buf(session_params const& sp, save_state_flags_t const flags)
{
	auto const e = write_session_params(sp, flags);
	std::vector<char> ret;
	bencode(std::back_inserter(ret), e);
	return ret;
}